

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_1_block(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  size_t sVar1;
  int *piVar2;
  
  sVar1 = (G->data).line_number_stack_size;
  (G->data).line_number_stack_size = sVar1 + 1;
  piVar2 = (int *)realloc((G->data).line_number_stack,sVar1 * 4 + 4);
  (G->data).line_number_stack = piVar2;
  if (piVar2 != (int *)0x0) {
    piVar2[(G->data).line_number_stack_size - 1] = (G->data).line_number;
    G->val[-1] = (PVIPNode *)0x0;
    return;
  }
  abort();
}

Assistant:

YY_ACTION(void) yy_1_block(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define s G->val[-1]
  yyprintf((stderr, "do yy_1_block"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {ENTER; s=NULL; }\n"));
  ENTER; s=NULL; ;
#undef s
}